

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void fl_open_display(Display *d)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  code *pcVar4;
  int error_base_1;
  int error_base;
  int num;
  XVisualInfo templt;
  
  fl_display = d;
  WM_DELETE_WINDOW = XInternAtom(d,"WM_DELETE_WINDOW",0);
  WM_PROTOCOLS = XInternAtom(d,"WM_PROTOCOLS",0);
  fl_MOTIF_WM_HINTS = XInternAtom(d,"_MOTIF_WM_HINTS",0);
  TARGETS = XInternAtom(d,"TARGETS",0);
  CLIPBOARD = XInternAtom(d,"CLIPBOARD",0);
  TIMESTAMP = XInternAtom(d,"TIMESTAMP",0);
  PRIMARY_TIMESTAMP = XInternAtom(d,"PRIMARY_TIMESTAMP",0);
  CLIPBOARD_TIMESTAMP = XInternAtom(d,"CLIPBOARD_TIMESTAMP",0);
  fl_XdndAware = XInternAtom(d,"XdndAware",0);
  fl_XdndSelection = XInternAtom(d,"XdndSelection",0);
  fl_XdndEnter = XInternAtom(d,"XdndEnter",0);
  fl_XdndTypeList = XInternAtom(d,"XdndTypeList",0);
  fl_XdndPosition = XInternAtom(d,"XdndPosition",0);
  fl_XdndLeave = XInternAtom(d,"XdndLeave",0);
  fl_XdndDrop = XInternAtom(d,"XdndDrop",0);
  fl_XdndStatus = XInternAtom(d,"XdndStatus",0);
  fl_XdndActionCopy = XInternAtom(d,"XdndActionCopy",0);
  fl_XdndFinished = XInternAtom(d,"XdndFinished",0);
  fl_XdndEnter = XInternAtom(d,"XdndEnter",0);
  fl_XdndURIList = XInternAtom(d,"text/uri-list",0);
  fl_Xatextplainutf = XInternAtom(d,"text/plain;charset=UTF-8",0);
  fl_Xatextplainutf2 = XInternAtom(d,"text/plain;charset=utf-8",0);
  fl_Xatextplain = XInternAtom(d,"text/plain",0);
  fl_XaText = XInternAtom(d,"TEXT",0);
  fl_XaCompoundText = XInternAtom(d,"COMPOUND_TEXT",0);
  fl_XaUtf8String = XInternAtom(d,"UTF8_STRING",0);
  fl_XaTextUriList = XInternAtom(d,"text/uri-list",0);
  fl_XaImageBmp = XInternAtom(d,"image/bmp",0);
  fl_XaImagePNG = XInternAtom(d,"image/png",0);
  fl_INCR = XInternAtom(d,"INCR",0);
  fl_NET_WM_PID = XInternAtom(d,"_NET_WM_PID",0);
  fl_NET_WM_NAME = XInternAtom(d,"_NET_WM_NAME",0);
  fl_NET_WM_ICON_NAME = XInternAtom(d,"_NET_WM_ICON_NAME",0);
  fl_NET_SUPPORTING_WM_CHECK = XInternAtom(d,"_NET_SUPPORTING_WM_CHECK",0);
  fl_NET_WM_STATE = XInternAtom(d,"_NET_WM_STATE",0);
  fl_NET_WM_STATE_FULLSCREEN = XInternAtom(d,"_NET_WM_STATE_FULLSCREEN",0);
  fl_NET_WM_FULLSCREEN_MONITORS = XInternAtom(d,"_NET_WM_FULLSCREEN_MONITORS",0);
  fl_NET_WORKAREA = XInternAtom(d,"_NET_WORKAREA",0);
  fl_NET_WM_ICON = XInternAtom(d,"_NET_WM_ICON",0);
  fl_NET_ACTIVE_WINDOW = XInternAtom(d,"_NET_ACTIVE_WINDOW",0);
  Fl::add_fd(*(int *)(d + 0x10),1,fd_callback,(void *)0x0);
  fl_screen = *(int *)(d + 0xe0);
  fl_message_window =
       XCreateSimpleWindow(d,*(undefined8 *)(*(long *)(d + 0xe8) + 0x10 + (long)fl_screen * 0x80),0,
                           0,1,1,0,0,0);
  templt.visualid =
       XVisualIDFromVisual(*(undefined8 *)(*(long *)(d + 0xe8) + 0x40 + (long)fl_screen * 0x80));
  fl_visual = (XVisualInfo *)XGetVisualInfo(d,1,&templt,&num);
  fl_colormap = *(Colormap *)(*(long *)(d + 0xe8) + 0x50 + (long)fl_screen * 0x80);
  fl_init_xim();
  iVar1 = XFixesQueryExtension(fl_display,&xfixes_event_base,&error_base);
  have_xfixes = iVar1 != 0;
  lVar2 = dlopen("libXrandr.so.2",1);
  if (lVar2 == 0) {
    lVar2 = dlopen("libXrandr.so",1);
    if (lVar2 == 0) goto LAB_001dbdb1;
  }
  pcVar3 = (code *)dlsym(lVar2,"XRRQueryExtension");
  pcVar4 = (code *)dlsym(lVar2,"XRRSelectInput");
  XRRUpdateConfiguration_f = (XRRUpdateConfiguration_type)dlsym(lVar2,"XRRUpdateConfiguration");
  if (pcVar4 != (code *)0x0 && pcVar3 != (code *)0x0) {
    iVar1 = (*pcVar3)(d,&randrEventBase,&error_base_1);
    if (iVar1 != 0) {
      (*pcVar4)(d,*(undefined8 *)(*(long *)(d + 0xe8) + 0x10 + (long)fl_screen * 0x80),1);
      goto LAB_001dbdb1;
    }
  }
  XRRUpdateConfiguration_f = (XRRUpdateConfiguration_type)0x0;
LAB_001dbdb1:
  XSelectInput(d,*(undefined8 *)(*(long *)(d + 0xe8) + 0x10 + (long)fl_screen * 0x80),0x400000);
  return;
}

Assistant:

void fl_open_display(Display* d) {
  fl_display = d;

  WM_DELETE_WINDOW      = XInternAtom(d, "WM_DELETE_WINDOW",    0);
  WM_PROTOCOLS          = XInternAtom(d, "WM_PROTOCOLS",        0);
  fl_MOTIF_WM_HINTS     = XInternAtom(d, "_MOTIF_WM_HINTS",     0);
  TARGETS               = XInternAtom(d, "TARGETS",             0);
  CLIPBOARD             = XInternAtom(d, "CLIPBOARD",           0);
  TIMESTAMP             = XInternAtom(d, "TIMESTAMP",           0);
  PRIMARY_TIMESTAMP     = XInternAtom(d, "PRIMARY_TIMESTAMP",   0);
  CLIPBOARD_TIMESTAMP   = XInternAtom(d, "CLIPBOARD_TIMESTAMP", 0);
  fl_XdndAware          = XInternAtom(d, "XdndAware",           0);
  fl_XdndSelection      = XInternAtom(d, "XdndSelection",       0);
  fl_XdndEnter          = XInternAtom(d, "XdndEnter",           0);
  fl_XdndTypeList       = XInternAtom(d, "XdndTypeList",        0);
  fl_XdndPosition       = XInternAtom(d, "XdndPosition",        0);
  fl_XdndLeave          = XInternAtom(d, "XdndLeave",           0);
  fl_XdndDrop           = XInternAtom(d, "XdndDrop",            0);
  fl_XdndStatus         = XInternAtom(d, "XdndStatus",          0);
  fl_XdndActionCopy     = XInternAtom(d, "XdndActionCopy",      0);
  fl_XdndFinished       = XInternAtom(d, "XdndFinished",        0);
  //fl_XdndProxy        = XInternAtom(d, "XdndProxy",           0);
  fl_XdndEnter          = XInternAtom(d, "XdndEnter",           0);
  fl_XdndURIList        = XInternAtom(d, "text/uri-list",       0);
  fl_Xatextplainutf     = XInternAtom(d, "text/plain;charset=UTF-8",0);
  fl_Xatextplainutf2    = XInternAtom(d, "text/plain;charset=utf-8",0);	// Firefox/Thunderbird needs this - See STR#2930
  fl_Xatextplain        = XInternAtom(d, "text/plain",          0);
  fl_XaText             = XInternAtom(d, "TEXT",                0);
  fl_XaCompoundText     = XInternAtom(d, "COMPOUND_TEXT",       0);
  fl_XaUtf8String       = XInternAtom(d, "UTF8_STRING",         0);
  fl_XaTextUriList      = XInternAtom(d, "text/uri-list",       0);
  fl_XaImageBmp         = XInternAtom(d, "image/bmp",           0);
  fl_XaImagePNG         = XInternAtom(d, "image/png",           0);
  fl_INCR               = XInternAtom(d, "INCR",                0);
  fl_NET_WM_PID         = XInternAtom(d, "_NET_WM_PID",         0);
  fl_NET_WM_NAME        = XInternAtom(d, "_NET_WM_NAME",        0);
  fl_NET_WM_ICON_NAME   = XInternAtom(d, "_NET_WM_ICON_NAME",   0);
  fl_NET_SUPPORTING_WM_CHECK = XInternAtom(d, "_NET_SUPPORTING_WM_CHECK", 0);
  fl_NET_WM_STATE       = XInternAtom(d, "_NET_WM_STATE",       0);
  fl_NET_WM_STATE_FULLSCREEN = XInternAtom(d, "_NET_WM_STATE_FULLSCREEN", 0);
  fl_NET_WM_FULLSCREEN_MONITORS = XInternAtom(d, "_NET_WM_FULLSCREEN_MONITORS", 0);
  fl_NET_WORKAREA       = XInternAtom(d, "_NET_WORKAREA",       0);
  fl_NET_WM_ICON        = XInternAtom(d, "_NET_WM_ICON",        0);
  fl_NET_ACTIVE_WINDOW  = XInternAtom(d, "_NET_ACTIVE_WINDOW",  0);

  if (sizeof(Atom) < 4)
    atom_bits = sizeof(Atom) * 8;

  Fl::add_fd(ConnectionNumber(d), POLLIN, fd_callback);

  fl_screen = DefaultScreen(d);

  fl_message_window =
    XCreateSimpleWindow(d, RootWindow(d,fl_screen), 0,0,1,1,0, 0, 0);

// construct an XVisualInfo that matches the default Visual:
  XVisualInfo templt; int num;
  templt.visualid = XVisualIDFromVisual(DefaultVisual(d, fl_screen));
  fl_visual = XGetVisualInfo(d, VisualIDMask, &templt, &num);
  fl_colormap = DefaultColormap(d, fl_screen);
  fl_init_xim();

#if !USE_COLORMAP
  Fl::visual(FL_RGB);
#endif

#if HAVE_XFIXES
  int error_base;
  if (XFixesQueryExtension(fl_display, &xfixes_event_base, &error_base))
    have_xfixes = true;
  else
    have_xfixes = false;
#endif

#if USE_XRANDR
  void *libxrandr_addr = dlopen("libXrandr.so.2", RTLD_LAZY);
  if (!libxrandr_addr)  libxrandr_addr = dlopen("libXrandr.so", RTLD_LAZY);
  if (libxrandr_addr) {
    int error_base;
    typedef Bool (*XRRQueryExtension_type)(Display*, int*, int*);
    typedef void (*XRRSelectInput_type)(Display*, Window, int);
    XRRQueryExtension_type XRRQueryExtension_f = (XRRQueryExtension_type)dlsym(libxrandr_addr, "XRRQueryExtension");
    XRRSelectInput_type XRRSelectInput_f = (XRRSelectInput_type)dlsym(libxrandr_addr, "XRRSelectInput");
    XRRUpdateConfiguration_f = (XRRUpdateConfiguration_type)dlsym(libxrandr_addr, "XRRUpdateConfiguration");
    if (XRRQueryExtension_f && XRRSelectInput_f && XRRQueryExtension_f(d, &randrEventBase, &error_base))
      XRRSelectInput_f(d, RootWindow(d, fl_screen), RRScreenChangeNotifyMask);
    else XRRUpdateConfiguration_f = NULL;
    }
#endif

  // Listen for changes to _NET_WORKAREA
  XSelectInput(d, RootWindow(d, fl_screen), PropertyChangeMask);
}